

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O0

int GuillotineBinPack::ScoreByHeuristic
              (int width,int height,Rect *freeRect,FreeRectChoiceHeuristic rectChoice)

{
  FreeRectChoiceHeuristic rectChoice_local;
  Rect *freeRect_local;
  int height_local;
  int width_local;
  
  switch(rectChoice) {
  case RectBestAreaFit:
    height_local = ScoreBestAreaFit(width,height,freeRect);
    break;
  case RectBestShortSideFit:
    height_local = ScoreBestShortSideFit(width,height,freeRect);
    break;
  case RectBestLongSideFit:
    height_local = ScoreBestLongSideFit(width,height,freeRect);
    break;
  case RectWorstAreaFit:
    height_local = ScoreWorstAreaFit(width,height,freeRect);
    break;
  case RectWorstShortSideFit:
    height_local = ScoreWorstShortSideFit(width,height,freeRect);
    break;
  case RectWorstLongSideFit:
    height_local = ScoreWorstLongSideFit(width,height,freeRect);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                  ,0x185,
                  "static int GuillotineBinPack::ScoreByHeuristic(int, int, const Rect &, FreeRectChoiceHeuristic)"
                 );
  }
  return height_local;
}

Assistant:

int GuillotineBinPack::ScoreByHeuristic(int width, int height, const Rect &freeRect, FreeRectChoiceHeuristic rectChoice)
{
	switch(rectChoice)
	{
	case RectBestAreaFit: return ScoreBestAreaFit(width, height, freeRect);
	case RectBestShortSideFit: return ScoreBestShortSideFit(width, height, freeRect);
	case RectBestLongSideFit: return ScoreBestLongSideFit(width, height, freeRect);
	case RectWorstAreaFit: return ScoreWorstAreaFit(width, height, freeRect);
	case RectWorstShortSideFit: return ScoreWorstShortSideFit(width, height, freeRect);
	case RectWorstLongSideFit: return ScoreWorstLongSideFit(width, height, freeRect);
	default: assert(false); return INT_MAX;
	}
}